

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O1

void anon_unknown.dwarf_608d4::assert_range_equals_msg(void)

{
  initializer_list<int> __l;
  string expected;
  vector<int,_std::allocator<int>_> v;
  deque<long,_std::allocator<long>_> li;
  string local_150;
  vector<int,_std::allocator<int>_> local_130;
  _Deque_base<long,_std::allocator<long>_> local_118;
  Assert local_c8 [5];
  _Deque_iterator<long,_long_&,_long_*> local_78;
  _Deque_iterator<long,_long_&,_long_*> local_50;
  
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x100000000;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_118;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l,(allocator_type *)&local_78);
  local_78._M_last = (_Elt_pointer)0x2;
  local_78._M_node = (_Map_pointer)0x3;
  local_78._M_cur = (_Elt_pointer)0x0;
  local_78._M_first = (_Elt_pointer)0x3;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<long,std::allocator<long>>::_M_range_initialize<long_const*>
            ((deque<long,std::allocator<long>> *)&local_118,&local_78);
  local_c8[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_c8[0].m_line = 0x18d;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Message.","");
  local_78._M_cur = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78._M_first = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78._M_last = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78._M_node = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
  local_50._M_cur = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50._M_first = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50._M_last = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50._M_node = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
  UnitTests::Assert::
  RangeEquals<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_c8,&local_150,&local_78,&local_50,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_118);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(assert_range_equals_msg)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::deque<long> li{0, 3, 2, 3};
            ASSERT_RANGE_EQUALS("Message.", li, v);
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();

            std::string expected =
                "error A1000: Assertion failure : Message. Expected range [4] different to actual range [4]\n"
                "\telement[0] = (0,0)\n"
                "\telement[1] = (3,1) <--------- HERE\n"
                "\telement[2] = (2,2)\n"
                "\telement[3] = (3,3)\n";

            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_RANGE_EQUALS", __FILE__, __LINE__);
            }
        }
    }